

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MPP_RET __thiscall MppDevServer::detach(MppDevServer *this,MppDevMppService *ctx)

{
  MppMutexCond *this_00;
  int iVar1;
  MppDevBatServ *pMVar2;
  undefined1 local_48 [8];
  AutoMutex auto_lock;
  MppDevSession *session;
  MppDevBatServ *server;
  MppClientType client_type;
  MppDevMppService *ctx_local;
  MppDevServer *this_local;
  
  if (this->mInited == 0) {
    _mpp_log_l(2,"mpp_server","mpp server failed for %s\n",(char *)0x0,this->mServerError);
    this_local._4_4_ = MPP_NOK;
  }
  else {
    pMVar2 = bat_server_get(this,ctx->client_type);
    auto_lock.mLock = (Mutex *)ctx->serv_ctx;
    if ((pMVar2 == (MppDevBatServ *)0x0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server","detach",
                   0x35a), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    Mutex::Autolock::Autolock((Autolock *)local_48,pMVar2->lock,1);
    if (ctx->serv_ctx != (void *)0x0) {
      ctx->server = ctx->client;
      ctx->serv_ctx = (void *)0x0;
      ctx->batch_io = 0;
      if ((pMVar2 == (MppDevBatServ *)0x0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server","detach",
                     0x364), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((auto_lock.mLock == (Mutex *)0x0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session","detach",
                     0x365), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((*(int *)((long)&auto_lock.mLock[1].mMutex + 0x20) != ctx->client) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "session->client == ctx->client","detach",0x366), (mpp_debug & 0x10000000) != 0
         )) {
        abort();
      }
      if ((*(int *)((long)&auto_lock.mLock[1].mMutex + 0x24) !=
           auto_lock.mLock[2].mMutex.__data.__lock) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "session->task_wait == session->task_done","detach",0x367),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      iVar1 = list_empty((list_head *)&((auto_lock.mLock)->mMutex).__data.__list);
      if ((iVar1 == 0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "list_empty(&session->list_wait)","detach",0x368),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      list_del_init((list_head *)((long)&(auto_lock.mLock)->mMutex + 8));
      if (((auto_lock.mLock)->mMutex).__align != 0) {
        this_00 = (MppMutexCond *)((auto_lock.mLock)->mMutex).__align;
        if (this_00 != (MppMutexCond *)0x0) {
          MppMutexCond::~MppMutexCond(this_00);
          operator_delete(this_00,0x58);
        }
        ((auto_lock.mLock)->mMutex).__align = 0;
      }
      mpp_mem_pool_put_f("detach",this->mSessionPool,auto_lock.mLock);
      pMVar2->batch_max_count = pMVar2->batch_max_count + 1;
      pMVar2->session_count = pMVar2->session_count + 1;
    }
    this_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET MppDevServer::detach(MppDevMppService *ctx)
{
    if (!mInited) {
        mpp_err("mpp server failed for %s\n", mServerError);
        return MPP_NOK;
    }

    MppClientType client_type = (MppClientType)ctx->client_type;

    MppDevBatServ *server = bat_server_get(client_type);
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;

    mpp_assert(server);

    AutoMutex auto_lock(server->lock);
    if (NULL == ctx->serv_ctx)
        return MPP_OK;

    ctx->server = ctx->client;
    ctx->serv_ctx = NULL;
    ctx->batch_io = 0;

    mpp_assert(server);
    mpp_assert(session);
    mpp_assert(session->client == ctx->client);
    mpp_assert(session->task_wait == session->task_done);
    mpp_assert(list_empty(&session->list_wait));

    list_del_init(&session->list_server);

    if (session->cond) {
        delete session->cond;
        session->cond = NULL;
    }

    mpp_mem_pool_put(mSessionPool, session);
    server->batch_max_count++;
    server->session_count++;

    return MPP_OK;
}